

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPf.c
# Opt level: O3

void Pf_StoDelete(Pf_Man_t *p)

{
  void *pvVar1;
  void **__ptr;
  int *piVar2;
  float *__ptr_00;
  Vec_Wec_t *__ptr_01;
  Vec_Mem_t *pVVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  long lVar6;
  long lVar7;
  
  iVar4 = (p->vPages).nSize;
  if (0 < iVar4) {
    lVar6 = 0;
    do {
      pvVar1 = (p->vPages).pArray[lVar6];
      if ((void *)0x2 < pvVar1) {
        free(pvVar1);
        iVar4 = (p->vPages).nSize;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar4);
  }
  __ptr = (p->vPages).pArray;
  if (__ptr != (void **)0x0) {
    free(__ptr);
    (p->vPages).pArray = (void **)0x0;
  }
  piVar2 = (p->vCutSets).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vCutSets).pArray = (int *)0x0;
  }
  __ptr_00 = (p->vCutFlows).pArray;
  if (__ptr_00 != (float *)0x0) {
    free(__ptr_00);
    (p->vCutFlows).pArray = (float *)0x0;
  }
  piVar2 = (p->vCutDelays).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vCutDelays).pArray = (int *)0x0;
  }
  if (p->pPfObjs != (Pf_Obj_t *)0x0) {
    free(p->pPfObjs);
    p->pPfObjs = (Pf_Obj_t *)0x0;
  }
  __ptr_01 = p->vTt2Match;
  iVar4 = __ptr_01->nCap;
  pVVar5 = __ptr_01->pArray;
  if (iVar4 < 1) {
    if (pVVar5 != (Vec_Int_t *)0x0) goto LAB_0070919a;
  }
  else {
    lVar7 = 8;
    lVar6 = 0;
    do {
      pvVar1 = *(void **)((long)&pVVar5->nCap + lVar7);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        pVVar5 = __ptr_01->pArray;
        *(undefined8 *)((long)&pVVar5->nCap + lVar7) = 0;
        iVar4 = __ptr_01->nCap;
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar6 < iVar4);
LAB_0070919a:
    free(pVVar5);
  }
  free(__ptr_01);
  pVVar3 = p->vTtMem;
  if (pVVar3 == (Vec_Mem_t *)0x0) goto LAB_00709228;
  pVVar5 = pVVar3->vTable;
  if (pVVar5 != (Vec_Int_t *)0x0) {
    if (pVVar5->pArray != (int *)0x0) {
      free(pVVar5->pArray);
      pVVar3->vTable->pArray = (int *)0x0;
      pVVar5 = pVVar3->vTable;
      if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_007091ec;
    }
    free(pVVar5);
    pVVar3->vTable = (Vec_Int_t *)0x0;
  }
LAB_007091ec:
  pVVar5 = pVVar3->vNexts;
  if (pVVar5 != (Vec_Int_t *)0x0) {
    if (pVVar5->pArray != (int *)0x0) {
      free(pVVar5->pArray);
      pVVar3->vNexts->pArray = (int *)0x0;
      pVVar5 = pVVar3->vNexts;
      if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_00709228;
    }
    free(pVVar5);
    pVVar3->vNexts = (Vec_Int_t *)0x0;
  }
LAB_00709228:
  pVVar3 = p->vTtMem;
  iVar4 = pVVar3->iPage;
  if (-1 < iVar4) {
    lVar6 = -1;
    do {
      if (pVVar3->ppPages[lVar6 + 1] != (word *)0x0) {
        free(pVVar3->ppPages[lVar6 + 1]);
        pVVar3->ppPages[lVar6 + 1] = (word *)0x0;
        iVar4 = pVVar3->iPage;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar4);
  }
  if (pVVar3->ppPages != (word **)0x0) {
    free(pVVar3->ppPages);
  }
  free(pVVar3);
  if (p->pCells != (Mio_Cell_t *)0x0) {
    free(p->pCells);
  }
  free(p);
  return;
}

Assistant:

void Pf_StoDelete( Pf_Man_t * p )
{
    Vec_PtrFreeData( &p->vPages );
    ABC_FREE( p->vPages.pArray );
    ABC_FREE( p->vCutSets.pArray );
    ABC_FREE( p->vCutFlows.pArray );
    ABC_FREE( p->vCutDelays.pArray );
    ABC_FREE( p->pPfObjs );
    // matching
    Vec_WecFree( p->vTt2Match );
    Vec_MemHashFree( p->vTtMem );
    Vec_MemFree( p->vTtMem );
    ABC_FREE( p->pCells );
    ABC_FREE( p );
}